

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O3

bool __thiscall
Environment::getVariable(Environment *this,string *variable,ResultValue *value,bool applyConversion)

{
  ResultValueType *__k;
  mapped_type *pmVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  ResultValueType local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  __k = &this->mEvalMode;
  pmVar1 = std::__detail::
           _Map_base<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)this,__k);
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)pmVar1,variable);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
      ._M_cur != (__node_type *)0x0) {
    if (applyConversion) {
      pmVar1 = std::__detail::
               _Map_base<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,__k);
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)pmVar1,variable);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
          ._M_cur == (__node_type *)0x0) {
LAB_001222ea:
        std::__throw_out_of_range("_Map_base::at");
      }
      ResultValue::convertTo
                ((ResultValue *)
                 ((long)cVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                        ._M_cur + 0x28),*__k);
      *(undefined8 *)((value->mComplexValue)._M_value + 8) = local_38;
    }
    else {
      pmVar1 = std::__detail::
               _Map_base<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,__k);
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)pmVar1,variable);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_001222ea;
      *(undefined8 *)((value->mComplexValue)._M_value + 8) =
           *(undefined8 *)
            ((long)cVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                   ._M_cur + 0x48);
      local_58 = *(ResultValueType *)
                  ((long)cVar3.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                         ._M_cur + 0x28);
      uStack_54 = *(undefined4 *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                          ._M_cur + 0x2c);
      uStack_50 = *(undefined4 *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                          ._M_cur + 0x30);
      uStack_4c = *(undefined4 *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                          ._M_cur + 0x34);
      local_48 = *(undefined4 *)
                  ((long)cVar3.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                         ._M_cur + 0x38);
      uStack_44 = *(undefined4 *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                          ._M_cur + 0x3c);
      uStack_40 = *(undefined4 *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                          ._M_cur + 0x40);
      uStack_3c = *(undefined4 *)
                   ((long)cVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
                          ._M_cur + 0x44);
    }
    *(undefined4 *)&value->mFloatValue = local_48;
    *(undefined4 *)((long)&value->mFloatValue + 4) = uStack_44;
    *(undefined4 *)(value->mComplexValue)._M_value = uStack_40;
    *(undefined4 *)((value->mComplexValue)._M_value + 4) = uStack_3c;
    value->mType = local_58;
    *(undefined4 *)&value->field_0x4 = uStack_54;
    *(undefined4 *)&value->mIntValue = uStack_50;
    *(undefined4 *)((long)&value->mIntValue + 4) = uStack_4c;
  }
  return cVar2.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool Environment::getVariable(std::string variable, ResultValue& value, bool applyConversion) const {
	if (variables().count(variable) > 0) {
		if (applyConversion) {
			value = variables().at(variable).convertTo(mEvalMode);
		} else {
			value = variables().at(variable);
		}

		return true;
	} else {
		return false;
	}
}